

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O0

void __thiscall
AV1Kmeans::AV1KmeansTest2::RunCheckOutput
          (AV1KmeansTest2 *this,av1_calc_indices_dim2_func test_impl,BLOCK_SIZE_conflict bsize,int k
          )

{
  bool bVar1;
  AssertHelper *this_00;
  Message *pMVar2;
  Message *pMVar3;
  AssertHelper *this_01;
  undefined4 in_ECX;
  byte in_DL;
  code *in_RSI;
  long in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int64_t total_dist_impl;
  int64_t total_dist_dim2;
  int n;
  int h;
  int w;
  char (*in_stack_fffffffffffffed8) [12];
  AssertHelper *in_stack_fffffffffffffee0;
  AV1KmeansTest2 *in_stack_fffffffffffffee8;
  uint8_t *in_stack_fffffffffffffef0;
  int16_t *in_stack_fffffffffffffef8;
  int line;
  int16_t *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  Type TVar4;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult *this_02;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar5;
  AssertionResult local_80;
  uint local_6c;
  AssertionResult local_48;
  undefined1 local_38 [20];
  int local_24;
  uint local_20;
  uint local_1c;
  undefined4 local_18;
  code *local_10;
  
  TVar4 = (Type)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_1c = (uint)::block_size_wide[in_DL];
  local_20 = (uint)::block_size_high[in_DL];
  local_24 = local_1c * local_20;
  local_18 = in_ECX;
  local_10 = in_RSI;
  av1_calc_indices_dim2_c
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             (int64_t *)in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
             (int)in_stack_fffffffffffffee0);
  (*local_10)(in_RDI + 0x1c,in_RDI + 0x401c,in_RDI + 0x503c,local_38,local_24,local_18);
  this_02 = &local_48;
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((char *)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
             (long *)in_stack_fffffffffffffee8,(long *)in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  uVar5 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    testing::AssertionResult::failure_message((AssertionResult *)0x9ecbbb);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,TVar4,(char *)in_stack_ffffffffffffff00,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(char *)in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff60),(Message *)this_02);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x9ecc18);
  }
  local_6c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9ecc86);
  if (local_6c == 0) {
    CheckResult(in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              ((char *)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
               (bool *)in_stack_fffffffffffffee8,(bool *)in_stack_fffffffffffffee0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff10);
      this_00 = (AssertHelper *)
                testing::Message::operator<<
                          ((Message *)in_stack_fffffffffffffee0,
                           (char (*) [8])in_stack_fffffffffffffed8);
      pMVar2 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffee0,
                          (anon_enum_8 *)in_stack_fffffffffffffed8);
      TVar4 = (Type)((ulong)pMVar2 >> 0x20);
      pMVar2 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffee0,
                          (char (*) [8])in_stack_fffffffffffffed8);
      pMVar3 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
      line = (int)((ulong)pMVar3 >> 0x20);
      pMVar3 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
      this_01 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x9ecde4);
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar4,(char *)pMVar2,line,(char *)pMVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff60),(Message *)this_02);
      testing::internal::AssertHelper::~AssertHelper(this_01);
      testing::Message::~Message((Message *)0x9ece3e);
    }
    local_6c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9ecea9);
  }
  return;
}

Assistant:

void AV1KmeansTest2::RunCheckOutput(av1_calc_indices_dim2_func test_impl,
                                    BLOCK_SIZE bsize, int k) {
  const int w = block_size_wide[bsize];
  const int h = block_size_high[bsize];
  const int n = w * h;
  int64_t total_dist_dim2, total_dist_impl;
  av1_calc_indices_dim2_c(data_, centroids_, indices1_, &total_dist_dim2, n, k);
  test_impl(data_, centroids_, indices2_, &total_dist_impl, n, k);

  ASSERT_EQ(total_dist_dim2, total_dist_impl);
  ASSERT_EQ(CheckResult(n), true)
      << " block " << bsize << " index " << n << " Centroids " << k;
}